

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O3

int Imf_3_4::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  long *plVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  ulong *puVar6;
  ulong *puVar7;
  void *__s;
  ulong uVar8;
  void *__s_00;
  long *__s_01;
  long *plVar9;
  long lVar10;
  uint64_t *hcode;
  long lVar11;
  ushort uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  char *outStart;
  char *pcVar26;
  int iVar27;
  char *pcVar28;
  ulong uVar29;
  uint uVar30;
  bool bVar31;
  int local_8c;
  int local_78;
  
  if (nRaw == 0) {
    return 0;
  }
  __s = operator_new__(0x80008);
  memset(__s,0,0x80008);
  if (0 < nRaw) {
    uVar8 = 0;
    do {
      plVar9 = (long *)((long)__s + (ulong)raw[uVar8] * 8);
      *plVar9 = *plVar9 + 1;
      uVar8 = uVar8 + 1;
    } while ((uint)nRaw != uVar8);
  }
  __s_00 = operator_new__(0x40004);
  memset(__s_00,0,0x40004);
  __s_01 = (long *)operator_new__(0x80008);
  memset(__s_01,0,0x80008);
  plVar9 = (long *)((long)__s + -8);
  uVar8 = 0xffffffffffffffff;
  do {
    uVar8 = uVar8 + 1;
    plVar1 = plVar9 + 1;
    plVar9 = plVar9 + 1;
  } while (*plVar1 == 0);
  local_8c = 0;
  iVar18 = 0;
  if (uVar8 < 0x10001) {
    local_8c = 0;
    iVar18 = 0;
    uVar13 = uVar8;
    do {
      *(int *)((long)__s_00 + uVar13 * 4) = (int)uVar13;
      if (*plVar9 != 0) {
        __s_01[iVar18] = (long)plVar9;
        iVar18 = iVar18 + 1;
        local_8c = (int)uVar13;
      }
      uVar13 = uVar13 + 1;
      plVar9 = plVar9 + 1;
    } while (uVar13 != 0x10001);
  }
  lVar10 = (long)local_8c;
  puVar14 = (ulong *)((long)__s + lVar10 * 8 + 8);
  *(undefined8 *)((long)__s + lVar10 * 8 + 8) = 1;
  __s_01[iVar18] = (long)puVar14;
  uVar30 = iVar18 + 1;
  if (0 < iVar18) {
    uVar13 = (long)(int)uVar30 - 2U >> 1;
    do {
      std::
      __adjust_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<Imf_3_4::(anonymous_namespace)::FHeapCompare>>
                (__s_01,uVar13,(long)(int)uVar30,__s_01[uVar13]);
      bVar31 = uVar13 != 0;
      uVar13 = uVar13 - 1;
    } while (bVar31);
  }
  hcode = (uint64_t *)operator_new__(0x80008);
  lVar10 = lVar10 + 1;
  memset(hcode,0,0x80008);
  if (0 < iVar18) {
    uVar13 = (ulong)uVar30;
    do {
      lVar11 = *__s_01;
      lVar4 = __s_01[uVar13 - 1];
      __s_01[uVar13 - 1] = lVar11;
      std::
      __adjust_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<Imf_3_4::(anonymous_namespace)::FHeapCompare>>
                (__s_01,0,(long)(uVar13 * 8 + -8) >> 3,lVar4);
      uVar17 = uVar13 - 1;
      lVar4 = *__s_01;
      if (1 < uVar17) {
        lVar5 = __s_01[uVar13 - 2];
        __s_01[uVar13 - 2] = lVar4;
        std::
        __adjust_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<Imf_3_4::(anonymous_namespace)::FHeapCompare>>
                  (__s_01,0,(long)(uVar13 * 8 + -0x10) >> 3,lVar5);
      }
      uVar21 = (ulong)(lVar11 - (long)__s) >> 3;
      uVar20 = (ulong)(lVar4 - (long)__s) >> 3;
      plVar9 = (long *)((long)__s + (long)(int)uVar20 * 8);
      *plVar9 = *plVar9 + *(long *)((long)__s + (long)(int)uVar21 * 8);
      uVar15 = uVar13 - 2;
      puVar6 = (ulong *)__s_01[uVar13 - 2];
      if (1 < uVar17) {
        uVar29 = *puVar6;
        do {
          uVar2 = uVar15 - 1;
          uVar25 = uVar2 >> 1;
          puVar7 = (ulong *)__s_01[uVar25];
          if ((*puVar7 <= uVar29) && ((puVar7 <= puVar6 || (*puVar7 != uVar29)))) goto LAB_0017dc3f;
          __s_01[uVar15] = (long)puVar7;
          uVar15 = uVar25;
        } while (1 < uVar2);
        uVar15 = 0;
      }
LAB_0017dc3f:
      __s_01[uVar15] = (long)puVar6;
      do {
        uVar23 = (uint)uVar20;
        lVar11 = (long)(int)uVar23;
        hcode[lVar11] = hcode[lVar11] + 1;
        uVar30 = *(uint *)((long)__s_00 + lVar11 * 4);
        uVar20 = (ulong)uVar30;
      } while (uVar30 != uVar23);
      *(int *)((long)__s_00 + lVar11 * 4) = (int)uVar21;
      do {
        uVar23 = (uint)uVar21;
        hcode[(int)uVar23] = hcode[(int)uVar23] + 1;
        uVar30 = *(uint *)((long)__s_00 + (long)(int)uVar23 * 4);
        uVar21 = (ulong)uVar30;
      } while (uVar30 != uVar23);
      iVar18 = (int)uVar13;
      uVar13 = uVar17;
    } while (2 < iVar18);
  }
  anon_unknown_0::hufCanonicalCodeTable(hcode);
  memcpy(__s,hcode,0x80008);
  operator_delete__(hcode);
  operator_delete__(__s_01);
  operator_delete__(__s_00);
  pcVar3 = compressed + 0x14;
  local_78 = (int)uVar8;
  pcVar26 = pcVar3;
  if (local_78 <= (int)lVar10) {
    uVar13 = 0;
    uVar15 = uVar8 & 0xffffffff;
    uVar17 = 0;
    do {
      iVar22 = (int)uVar15;
      lVar11 = (long)iVar22;
      uVar15 = *(ulong *)((long)__s + lVar11 * 8) & 0x3f;
      iVar18 = (int)uVar13;
      if (local_8c < iVar22 || uVar15 != 0) {
LAB_0017dd27:
        uVar17 = uVar17 << 6 | uVar15;
        if (iVar18 < 2) {
LAB_0017ddc3:
          uVar13 = (ulong)(iVar18 + 6);
        }
        else {
          uVar13 = (ulong)(iVar18 + 6);
          do {
            uVar13 = uVar13 - 8;
            *pcVar26 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
            pcVar26 = pcVar26 + 1;
          } while (7 < uVar13);
        }
      }
      else {
        uVar30 = 1;
        while (uVar23 = uVar30, (*(byte *)((long)__s + lVar11 * 8 + 8) & 0x3f) == 0) {
          lVar11 = lVar11 + 1;
          uVar23 = uVar30 + 1;
          if ((lVar10 <= lVar11) || (bVar31 = 0x103 < uVar30, uVar30 = uVar23, bVar31)) break;
        }
        iVar22 = (int)lVar11;
        if (uVar23 < 2) goto LAB_0017dd27;
        if (uVar23 < 6) {
          uVar17 = uVar17 << 6 | (ulong)(uVar23 + 0x39);
          if (1 < iVar18) {
            uVar13 = (ulong)(iVar18 + 6);
            do {
              uVar13 = uVar13 - 8;
              *pcVar26 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
              pcVar26 = pcVar26 + 1;
            } while (7 < uVar13);
            goto LAB_0017ddc5;
          }
          goto LAB_0017ddc3;
        }
        uVar13 = uVar17 << 6 | 0x3f;
        if (iVar18 < 2) {
          uVar17 = uVar13 << 8 | (ulong)(uVar23 - 6);
          uVar30 = iVar18 + 0xe;
          uVar13 = (ulong)uVar30;
          if ((int)(iVar18 + 6U) < 0) goto LAB_0017ddc5;
        }
        else {
          uVar17 = (ulong)(iVar18 + 6U);
          uVar30 = iVar18 + 0xe;
          do {
            uVar17 = uVar17 - 8;
            *pcVar26 = (char)(uVar13 >> ((byte)uVar17 & 0x3f));
            pcVar26 = pcVar26 + 1;
            uVar30 = uVar30 - 8;
          } while (7 < uVar17);
          uVar17 = uVar13 << 8 | (ulong)(uVar23 - 6);
        }
        uVar13 = (ulong)uVar30;
        do {
          uVar13 = uVar13 - 8;
          *pcVar26 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
          pcVar26 = pcVar26 + 1;
        } while (7 < uVar13);
      }
LAB_0017ddc5:
      uVar15 = (ulong)(iVar22 + 1);
    } while (iVar22 <= local_8c);
    if (0 < (int)uVar13) {
      *pcVar26 = (char)(uVar17 << (8U - (char)uVar13 & 0x3f));
      pcVar26 = pcVar26 + 1;
    }
  }
  uVar12 = *raw;
  pcVar28 = pcVar26;
  if (nRaw < 2) {
    uVar17 = 0;
    uVar13 = 0;
    iVar18 = 0;
  }
  else {
    iVar18 = 0;
    uVar15 = 1;
    uVar13 = 0;
    uVar17 = 0;
    do {
      if (iVar18 < 0xff && uVar12 == raw[uVar15]) {
        iVar22 = iVar18 + 1;
      }
      else {
        uVar20 = *(ulong *)((long)__s + (ulong)uVar12 * 8);
        uVar21 = *puVar14;
        uVar19 = (uint)uVar20;
        uVar23 = uVar19 & 0x3f;
        uVar30 = (uint)uVar21;
        uVar24 = uVar30 & 0x3f;
        uVar29 = (ulong)iVar18;
        if ((ulong)uVar23 + (ulong)uVar24 + 8 < uVar23 * uVar29) {
          uVar17 = uVar17 << (sbyte)uVar23 | uVar20 >> 6;
          uVar23 = (uVar19 & 0x3f) + (int)uVar13;
          uVar13 = (ulong)uVar23;
          if (7 < (int)uVar23) {
            uVar13 = (ulong)uVar23;
            do {
              uVar13 = uVar13 - 8;
              *pcVar28 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
              pcVar28 = pcVar28 + 1;
            } while (7 < uVar13);
          }
          uVar30 = uVar30 & 0x3f;
          uVar17 = uVar17 << (sbyte)uVar24 | uVar21 >> 6;
          uVar23 = (int)uVar13 + uVar30;
          if ((int)uVar23 < 8) {
            uVar30 = uVar23 + 8;
            uVar13 = (ulong)uVar30;
            uVar17 = uVar17 << 8 | uVar29;
            if (-1 < (int)uVar23) goto LAB_0017df87;
          }
          else {
            uVar20 = (ulong)uVar23;
            uVar30 = uVar30 + (int)uVar13 + 8;
            do {
              uVar20 = uVar20 - 8;
              *pcVar28 = (char)(uVar17 >> ((byte)uVar20 & 0x3f));
              pcVar28 = pcVar28 + 1;
              uVar30 = uVar30 - 8;
            } while (7 < uVar20);
            uVar17 = uVar17 << 8 | uVar29;
LAB_0017df87:
            uVar13 = (ulong)uVar30;
            do {
              uVar13 = uVar13 - 8;
              *pcVar28 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
              pcVar28 = pcVar28 + 1;
            } while (7 < uVar13);
          }
          iVar22 = 0;
        }
        else {
          iVar22 = 0;
          if (-1 < iVar18) {
            do {
              uVar30 = (int)uVar13 + (uVar19 & 0x3f);
              uVar13 = (ulong)uVar30;
              uVar17 = uVar17 << (sbyte)uVar23 | uVar20 >> 6;
              if (7 < (int)uVar30) {
                uVar13 = (ulong)uVar30;
                do {
                  uVar13 = uVar13 - 8;
                  *pcVar28 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
                  pcVar28 = pcVar28 + 1;
                } while (7 < uVar13);
              }
              bVar31 = 0 < iVar18;
              iVar18 = iVar18 + -1;
            } while (bVar31);
          }
        }
      }
      iVar18 = iVar22;
      uVar12 = raw[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)nRaw);
  }
  uVar15 = *(ulong *)((long)__s + (ulong)uVar12 * 8);
  uVar20 = *puVar14;
  uVar19 = (uint)uVar15;
  uVar23 = uVar19 & 0x3f;
  uVar30 = (uint)uVar20;
  uVar24 = uVar30 & 0x3f;
  uVar21 = (ulong)iVar18;
  if ((ulong)uVar23 + (ulong)uVar24 + 8 < uVar23 * uVar21) {
    uVar17 = uVar17 << (sbyte)uVar23 | uVar15 >> 6;
    uVar23 = (uVar19 & 0x3f) + (int)uVar13;
    uVar13 = (ulong)uVar23;
    if (7 < (int)uVar23) {
      uVar13 = (ulong)uVar23;
      do {
        uVar13 = uVar13 - 8;
        *pcVar28 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
        pcVar28 = pcVar28 + 1;
      } while (7 < uVar13);
    }
    uVar30 = uVar30 & 0x3f;
    uVar17 = uVar17 << (sbyte)uVar24 | uVar20 >> 6;
    uVar23 = (int)uVar13 + uVar30;
    if ((int)uVar23 < 8) {
      uVar30 = uVar23 + 8;
      uVar13 = (ulong)uVar30;
      uVar17 = uVar17 << 8 | uVar21;
      if ((int)uVar23 < 0) goto LAB_0017e0df;
    }
    else {
      uVar15 = (ulong)uVar23;
      uVar30 = uVar30 + (int)uVar13 + 8;
      do {
        uVar15 = uVar15 - 8;
        *pcVar28 = (char)(uVar17 >> ((byte)uVar15 & 0x3f));
        pcVar28 = pcVar28 + 1;
        uVar30 = uVar30 - 8;
      } while (7 < uVar15);
      uVar17 = uVar17 << 8 | uVar21;
    }
    uVar13 = (ulong)uVar30;
    do {
      uVar13 = uVar13 - 8;
      *pcVar28 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
      pcVar28 = pcVar28 + 1;
    } while (7 < uVar13);
  }
  else if (-1 < iVar18) {
    do {
      uVar30 = (int)uVar13 + (uVar19 & 0x3f);
      uVar13 = (ulong)uVar30;
      uVar17 = uVar17 << (sbyte)uVar23 | uVar15 >> 6;
      if (7 < (int)uVar30) {
        uVar13 = (ulong)uVar30;
        do {
          uVar13 = uVar13 - 8;
          *pcVar28 = (char)(uVar17 >> ((byte)uVar13 & 0x3f));
          pcVar28 = pcVar28 + 1;
        } while (7 < uVar13);
      }
      bVar31 = 0 < iVar18;
      iVar18 = iVar18 + -1;
    } while (bVar31);
  }
LAB_0017e0df:
  iVar18 = (int)uVar13;
  if (iVar18 != 0) {
    *pcVar28 = (char)(uVar17 << (8U - (char)uVar13 & 0x3f));
  }
  iVar27 = (int)pcVar28 - (int)pcVar26;
  lVar11 = (long)pcVar26 - (long)pcVar3;
  iVar16 = iVar18 + iVar27 * 8 + 7;
  iVar22 = iVar18 + iVar27 * 8 + 0xe;
  if (-1 < iVar16) {
    iVar22 = iVar16;
  }
  *compressed = (char)uVar8;
  compressed[1] = (char)(uVar8 >> 8);
  compressed[2] = (char)(uVar8 >> 0x10);
  compressed[3] = (char)(uVar8 >> 0x18);
  compressed[4] = (char)lVar10;
  compressed[5] = (char)((ulong)lVar10 >> 8);
  compressed[6] = (char)((ulong)lVar10 >> 0x10);
  compressed[7] = (char)((ulong)lVar10 >> 0x18);
  compressed[8] = (char)lVar11;
  compressed[9] = (char)((ulong)lVar11 >> 8);
  compressed[10] = (char)((ulong)lVar11 >> 0x10);
  compressed[0xb] = (char)((ulong)lVar11 >> 0x18);
  iVar18 = iVar18 + iVar27 * 8;
  compressed[0xc] = (char)iVar18;
  compressed[0xd] = (char)((uint)iVar18 >> 8);
  compressed[0xe] = (char)((uint)iVar18 >> 0x10);
  compressed[0xf] = (char)((uint)iVar18 >> 0x18);
  compressed[0x10] = '\0';
  compressed[0x11] = '\0';
  compressed[0x12] = '\0';
  compressed[0x13] = '\0';
  operator_delete__(__s);
  return ((iVar22 >> 3) + (int)pcVar26) - (int)compressed;
}

Assistant:

int
hufCompress (const unsigned short raw[], int nRaw, char compressed[])
{
    if (nRaw == 0) return 0;

    AutoArray<uint64_t, HUF_ENCSIZE> freq;

    countFrequencies (freq, raw, nRaw);

    int im = 0;
    int iM = 0;
    hufBuildEncTable (freq, &im, &iM);

    char* tableStart = compressed + 20;
    char* tableEnd   = tableStart;
    hufPackEncTable (freq, im, iM, &tableEnd);
    int tableLength = tableEnd - tableStart;

    char* dataStart  = tableEnd;
    int   nBits      = hufEncode (freq, raw, nRaw, iM, dataStart);
    int   dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    return dataStart + dataLength - compressed;
}